

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageReceiver.cpp
# Opt level: O3

bool __thiscall
unixsocketipc::MessageReceiver::receive_buffer
          (MessageReceiver *this,int client_socket_fd,char *buf,uint32_t size)

{
  ssize_t sVar1;
  uint32_t num_bytes_left;
  uint uVar2;
  
  if (size == 0) {
    return true;
  }
  do {
    sVar1 = recv(client_socket_fd,buf,(ulong)size,0);
    uVar2 = (uint)sVar1;
    if ((int)uVar2 < 1) {
      return 0 < (int)uVar2;
    }
    buf = buf + (uVar2 & 0x7fffffff);
    size = size - uVar2;
  } while (size != 0);
  return 0 < (int)uVar2;
}

Assistant:

bool MessageReceiver::receive_buffer(int client_socket_fd, char* buf, uint32_t size) {
   auto num_bytes_left = size;
   int num_bytes_received;
   while ((num_bytes_left > 0) && ((num_bytes_received = recv(client_socket_fd, buf, num_bytes_left, 0)) > 0)) {
      num_bytes_left -= num_bytes_received;
      buf += num_bytes_received;
      DEBUG_MSG("%s: received %d bytes\n", __FUNCTION__, num_bytes_received);
   }

   return (num_bytes_left == 0);
}